

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_mtdf.c
# Opt level: O0

short SEARCH_mtdf(chess_state_t *s,search_state_t *search_state,uchar depth,move_t *move,short guess
                 )

{
  short sVar1;
  undefined1 local_d0 [8];
  chess_state_t state;
  short local_38;
  short local_36;
  move_t movetemp;
  short beta;
  short bounds [2];
  short guess_local;
  move_t *move_local;
  uchar depth_local;
  search_state_t *search_state_local;
  chess_state_t *s_local;
  
  memcpy(local_d0,s,0x90);
  state.hash._0_4_ = 0;
  local_36 = -1000 - (depth + 1);
  movetemp._0_2_ = depth + 0x3e9;
  movetemp._2_2_ = guess;
  do {
    if ((short)movetemp <= local_36) {
      return movetemp._2_2_;
    }
    if (movetemp._2_2_ == local_36) {
      local_38 = movetemp._2_2_ + 1;
    }
    else {
      local_38 = movetemp._2_2_;
    }
    movetemp._2_2_ =
         SEARCH_nullwindow((chess_state_t *)local_d0,search_state,depth,'\0',
                           (move_t *)&state.field_0x8c,local_38);
    sVar1 = movetemp._2_2_;
    if (local_38 <= movetemp._2_2_) {
      *move = state._140_4_;
      (search_state->pv).size = search_state->pv_table[0].size;
      memcpy(&search_state->pv,search_state->pv_table,(long)(search_state->pv).size << 2);
      local_36 = movetemp._2_2_;
      sVar1 = (short)movetemp;
    }
    movetemp._0_2_ = sVar1;
  } while (search_state->abort_search == 0);
  return 0;
}

Assistant:

short SEARCH_mtdf(const chess_state_t *s, search_state_t *search_state, const unsigned char depth, move_t *move, short guess)
{
    short bounds[2];
    short beta;
    move_t movetemp;
    chess_state_t state = *s;
    
    /* Trick to disable null-move pruning on the first level of search */
    state.last_move = 0;
    
    bounds[0] = SEARCH_MIN_RESULT(depth+1);
    bounds[1] = SEARCH_MAX_RESULT(depth+1);
    
    while(bounds[0] < bounds[1]) {
        if(guess == bounds[0]) {
            beta = guess + 1;
        } else {
            beta = guess;
        }

        guess = SEARCH_nullwindow(&state, search_state, depth, 0, &movetemp, beta);

        if(guess < beta) {
            bounds[1] = guess;
        } else {
            bounds[0] = guess;
            *move = movetemp;
            search_state->pv.size = search_state->pv_table[0].size;
            memcpy(search_state->pv.moves, search_state->pv_table[0].moves, search_state->pv.size * sizeof(move_t));
        }
        
        if(search_state->abort_search) {
            return 0;
        }
    }
    
    return guess;
}